

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::AddProperty
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  bool bVar1;
  ObjectSlotAttributes attr;
  uint16 uVar2;
  ScriptContext *pSVar3;
  DynamicTypeHandler *pDVar4;
  PropertyValueInfo *info_local;
  PropertyAttributes attributes_local;
  Var value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  bVar1 = ObjectSlotAttributesContains(attributes);
  if (bVar1) {
    attr = PropertyAttributesToObjectSlotAttributes(attributes);
    this_local._4_4_ =
         AddPropertyInternal(this,instance,propertyId,value,attr,info,flags,possibleSideEffects);
  }
  else {
    pSVar3 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    pSVar3->convertPathToDictionaryAttributesCount =
         pSVar3->convertPathToDictionaryAttributesCount + 1;
    uVar2 = GetPathLength(this);
    pDVar4 = TryConvertToSimpleDictionaryType(this,instance,uVar2 + 1,false);
    this_local._4_4_ =
         (*pDVar4->_vptr_DynamicTypeHandler[0x3a])
                   (pDVar4,instance,(ulong)(uint)propertyId,value,(ulong)attributes,info,flags,
                    (uint)possibleSideEffects);
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerBase::AddProperty(DynamicObject * instance, PropertyId propertyId, Js::Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        if (!ObjectSlotAttributesContains(attributes))
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryAttributesCount++;
#endif
            // Setting an attribute that PathTypeHandler can't express
            return TryConvertToSimpleDictionaryType(instance, GetPathLength() + 1)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
        }
        return AddPropertyInternal(instance, propertyId, value, PropertyAttributesToObjectSlotAttributes(attributes), info, flags, possibleSideEffects);
    }